

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aniconverter.h
# Opt level: O1

int ani::extract_ani_frames(path *p,path *out_p)

{
  void *pvVar1;
  ulong uVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  pointer __x;
  char *pcVar7;
  finfo f_info;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  frames;
  ani_header header;
  ofstream outfile;
  ifstream aniFile;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_488;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_470;
  ani_header local_458;
  long local_438;
  filebuf local_430 [240];
  ios_base local_340 [264];
  char local_238 [520];
  
  local_458.framerate = 0;
  local_458.frame_buff_sz = 0;
  local_458.unknown_1 = 0;
  local_458.signature = 0;
  local_458.frames_count = 0;
  local_458.file_size = 0;
  local_458.unknown_0 = 0;
  std::ifstream::ifstream(local_238,(p->_M_pathname)._M_dataplus._M_p,_S_bin|_S_ate);
  uVar2 = std::istream::tellg();
  if (uVar2 < 0x20) {
    lVar4 = 0x12;
    pcVar7 = "ANI file too short";
  }
  else {
    std::istream::seekg(local_238,0,0);
    std::istream::read(local_238,(long)&local_458);
    if (local_458.signature == 0x8f2a6ec9) {
      print_ani_header(&local_458);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::vector(&local_470,(ulong)local_458._0_8_ >> 0x20,(allocator_type *)&local_438);
      std::ofstream::ofstream(&local_438,(out_p->_M_pathname)._M_dataplus._M_p,_S_bin);
      if (local_458.frames_count != 0) {
        lVar4 = 0;
        uVar2 = 0;
        do {
          local_488.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = 0;
          std::istream::read(local_238,(long)&local_488);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Frame ",6);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," sz: ",5);
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          pcVar7 = " (start frame)";
          if (-1 < (int)(uint)local_488.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start) {
            pcVar7 = "";
          }
          lVar5 = 0xe;
          if (-1 < (int)(uint)local_488.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start) {
            lVar5 = 0;
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar7,lVar5);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     ((long)&((local_470.
                               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_start + lVar4),
                     (ulong)((uint)local_488.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start & 0x7fffffff));
          std::istream::read(local_238,
                             *(long *)((long)&((local_470.
                                                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              )._M_impl.super__Vector_impl_data._M_start + lVar4));
          uVar2 = uVar2 + 1;
          lVar4 = lVar4 + 0x18;
        } while (uVar2 < (ulong)local_458._0_8_ >> 0x20);
      }
      if (local_470.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_470.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        __x = local_470.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
        do {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_488,__x);
          std::ostream::write((char *)&local_438,
                              CONCAT44(local_488.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       (uint)local_488.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start));
          pvVar1 = (void *)CONCAT44(local_488.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    (uint)local_488.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
          if (pvVar1 != (void *)0x0) {
            operator_delete(pvVar1,(long)local_488.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)pvVar1);
          }
          __x = __x + 1;
        } while (__x != local_470.
                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
      }
      local_438 = _VTT;
      *(undefined8 *)(local_430 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
      std::filebuf::~filebuf(local_430);
      std::ios_base::~ios_base(local_340);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::~vector(&local_470);
      iVar6 = 0;
      goto LAB_00108a00;
    }
    lVar4 = 0x16;
    pcVar7 = "ANI signature mismatch";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar7,lVar4);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
  std::ostream::put(' ');
  iVar6 = -1;
  std::ostream::flush();
LAB_00108a00:
  std::ifstream::~ifstream(local_238);
  return iVar6;
}

Assistant:

inline int extract_ani_frames(const fs::path &p, const fs::path &out_p) {

        ani_header header{};

        ifstream aniFile(p, ios::binary | ios::ate);
        auto fileSize = aniFile.tellg();
        if (fileSize < sizeof(ani_header)) {
            std::cerr << "ANI file too short" << std::endl;
            return -1;
        }

        aniFile.seekg(0);
        aniFile.read(reinterpret_cast<char *>(&header), sizeof(ani_header));
        if (header.signature != ANI_MAGIC) {
            std::cerr << "ANI signature mismatch" << std::endl;
            return -1;
        }

        print_ani_header(header);

        vector<vector<uint8_t>> frames(header.frames_count);

        ofstream outfile(out_p, ios::binary);

        for (auto i = 0; i < header.frames_count; ++i) {
            finfo f_info{};
            aniFile.read(reinterpret_cast<char *>(&f_info), sizeof(finfo));

            std::cout << "Frame " << i << " sz: " << f_info.length
                      << (f_info.start_frame? " (start frame)" : "") << std::endl;

            frames[i].resize(f_info.length);
            aniFile.read(reinterpret_cast<char *>(frames[i].data()), f_info.length);
        }

        for (auto f : frames) {
            outfile.write(reinterpret_cast<char *>(f.data()), (long) f.size());
        }

        return 0;
    }